

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

RealType __thiscall OpenMD::EAMAdapter::getF3plus(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  undefined8 local_70;
  EAMAdapter *in_stack_ffffffffffffffa8;
  
  getZhouParam(in_stack_ffffffffffffffa8);
  ZhouParameters::~ZhouParameters(local_70);
  return (RealType)local_70;
}

Assistant:

RealType EAMAdapter::getF3plus() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.F3plus;
  }